

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Ref __thiscall
cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
          (ValueBuilder *this,IString target,Ref args,Ref args_1)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  Ref RVar4;
  size_t i;
  long lVar5;
  undefined1 *puVar6;
  Ref argArray [2];
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  pVVar2->type = Null;
  RVar3.inst = cashew::Value::setArray(pVVar2,2);
  argArray[0] = args;
  lVar5 = 0;
  do {
    cashew::Value::push_back(RVar3.inst,argArray[lVar5 + -1].inst);
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = cashew::Value::setArray(pVVar2,3);
  puVar6 = &DAT_00000018;
  RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar4.inst)->type = Null;
  cashew::Value::free(RVar4.inst,puVar6);
  (RVar4.inst)->type = String;
  pcVar1 = DAT_00dbdd40;
  ((RVar4.inst)->field_1).str.str._M_len = CALL;
  ((RVar4.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar4);
  puVar6 = &DAT_00000018;
  RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar4.inst)->type = Null;
  cashew::Value::free(RVar4.inst,puVar6);
  (RVar4.inst)->type = String;
  ((RVar4.inst)->field_1).arr = (ArrayStorage *)this;
  ((RVar4.inst)->field_1).str.str._M_str = (char *)target.str._M_len;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar4);
  RVar3.inst = cashew::Value::push_back(pVVar2,RVar3);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeCall(IString target, Ts... args) {
    size_t nArgs = sizeof...(Ts);
    Ref callArgs = makeRawArray(nArgs);
    Ref argArray[] = {args...};
    for (size_t i = 0; i < nArgs; ++i) {
      callArgs->push_back(argArray[i]);
    }
    return &makeRawArray(3)
              ->push_back(makeRawString(CALL))
              .push_back(makeName(target))
              .push_back(callArgs);
  }